

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
* __thiscall
flow::MatchInstr::cases
          (vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
           *__return_storage_ptr__,MatchInstr *this)

{
  pointer ppVVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  BasicBlock *code;
  Constant *label;
  BasicBlock *local_40;
  Constant *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = ((long)(this->super_TerminateInstr).super_Instr.operands_.
                 super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_TerminateInstr).super_Instr.operands_.
                 super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) - 2;
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    lVar4 = uVar3 + (uVar3 == 0);
    lVar2 = 0x18;
    do {
      ppVVar1 = (this->super_TerminateInstr).super_Instr.operands_.
                super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = *(Constant **)((long)ppVVar1 + lVar2 + -8);
      local_40 = *(BasicBlock **)((long)ppVVar1 + lVar2);
      std::
      vector<std::pair<flow::Constant*,flow::BasicBlock*>,std::allocator<std::pair<flow::Constant*,flow::BasicBlock*>>>
      ::emplace_back<flow::Constant*&,flow::BasicBlock*&>
                ((vector<std::pair<flow::Constant*,flow::BasicBlock*>,std::allocator<std::pair<flow::Constant*,flow::BasicBlock*>>>
                  *)__return_storage_ptr__,&local_38,&local_40);
      lVar2 = lVar2 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Constant*, BasicBlock*>> MatchInstr::cases() const {
  std::vector<std::pair<Constant*, BasicBlock*>> out;

  size_t caseCount = (operands().size() - 2) / 2;

  for (size_t i = 0; i < caseCount; ++i) {
    auto label = static_cast<Constant*>(operand(2 + 2 * i + 0));
    auto code = static_cast<BasicBlock*>(operand(2 + 2 * i + 1));

    out.emplace_back(label, code);
  }

  return out;
}